

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ghosts.c
# Opt level: O3

void pnga_update_ghosts(Integer g_a)

{
  int iVar1;
  bool bVar2;
  
  iVar1 = _ga_sync_end;
  bVar2 = _ga_sync_begin != 0;
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  if (bVar2) {
    pnga_pgroup_sync((long)GA[g_a + 1000].p_handle);
  }
  pnga_update4_ghosts(g_a);
  if (iVar1 != 0) {
    pnga_pgroup_sync((long)GA[g_a + 1000].p_handle);
    return;
  }
  return;
}

Assistant:

void pnga_update_ghosts(Integer g_a)
{
  /* Wrapper program for ghost cell update operations. If optimized
     update operation fails then use slow but robust version of
     update operation */
   int local_sync_begin,local_sync_end;
   Integer handle = GA_OFFSET + g_a;

   local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
   _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
   if(local_sync_begin)pnga_pgroup_sync(GA[handle].p_handle);

   if (!pnga_update4_ghosts(g_a))
   {
     pnga_update1_ghosts(g_a);
   }

   if(local_sync_end)pnga_pgroup_sync(GA[handle].p_handle);
}